

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::rescalePartials
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *scaleFactors,
          float *cumulativeScaleFactors,int fillWithOnes)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  bool bVar18;
  byte bVar19;
  byte bVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  ushort uVar29;
  float fVar30;
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  double dVar36;
  undefined1 auVar37 [64];
  
  if (0 < this->kPatternCount) {
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    lVar28 = 0;
    do {
      iVar2 = this->kCategoryCount;
      fVar30 = 1.0;
      if (0 < iVar2) {
        iVar3 = this->kPartialsPaddedStateCount;
        auVar37 = ZEXT864(0) << 0x20;
        iVar24 = 0;
        iVar22 = (int)lVar28 * iVar3;
        do {
          if (0 < this->kStateCount) {
            lVar26 = 0;
            do {
              lVar21 = iVar22 + lVar26;
              lVar26 = lVar26 + 1;
              auVar16 = vmaxss_avx(ZEXT416((uint)destP[lVar21]),auVar37._0_16_);
              auVar37 = ZEXT1664(auVar16);
            } while (this->kStateCount != (int)lVar26);
          }
          iVar24 = iVar24 + 1;
          iVar22 = iVar22 + this->kPaddedPatternCount * iVar3;
        } while (iVar24 != iVar2);
        uVar17 = vcmpss_avx512f(auVar37._0_16_,ZEXT416(0),0);
        bVar18 = (bool)((byte)uVar17 & 1);
        fVar30 = (float)((uint)bVar18 * 0x3f800000 + (uint)!bVar18 * auVar37._0_4_);
        if (0 < iVar2) {
          iVar22 = this->kStateCount;
          iVar24 = this->kPaddedPatternCount;
          iVar23 = iVar3 * (int)lVar28;
          auVar37 = vpbroadcastq_avx512f();
          iVar25 = 0;
          auVar33 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar30)));
          do {
            if (0 < iVar22) {
              uVar27 = 0;
              do {
                auVar34 = vpbroadcastq_avx512f();
                auVar35 = vporq_avx512f(auVar34,auVar31);
                auVar34 = vporq_avx512f(auVar34,auVar32);
                uVar17 = vpcmpuq_avx512f(auVar34,auVar37,2);
                bVar19 = (byte)uVar17;
                uVar17 = vpcmpuq_avx512f(auVar35,auVar37,2);
                bVar20 = (byte)uVar17;
                uVar29 = CONCAT11(bVar20,bVar19);
                pfVar1 = destP + (long)iVar23 + uVar27;
                auVar34._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * (int)pfVar1[1];
                auVar34._0_4_ = (uint)(bVar19 & 1) * (int)*pfVar1;
                auVar34._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * (int)pfVar1[2];
                auVar34._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * (int)pfVar1[3];
                auVar34._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * (int)pfVar1[4];
                auVar34._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * (int)pfVar1[5];
                auVar34._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * (int)pfVar1[6];
                auVar34._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * (int)pfVar1[7];
                auVar34._32_4_ = (uint)(bVar20 & 1) * (int)pfVar1[8];
                auVar34._36_4_ = (uint)(bVar20 >> 1 & 1) * (int)pfVar1[9];
                auVar34._40_4_ = (uint)(bVar20 >> 2 & 1) * (int)pfVar1[10];
                auVar34._44_4_ = (uint)(bVar20 >> 3 & 1) * (int)pfVar1[0xb];
                auVar34._48_4_ = (uint)(bVar20 >> 4 & 1) * (int)pfVar1[0xc];
                auVar34._52_4_ = (uint)(bVar20 >> 5 & 1) * (int)pfVar1[0xd];
                auVar34._56_4_ = (uint)(bVar20 >> 6 & 1) * (int)pfVar1[0xe];
                auVar34._60_4_ = (uint)(bVar20 >> 7) * (int)pfVar1[0xf];
                auVar34 = vmulps_avx512f(auVar33,auVar34);
                pfVar1 = destP + (long)iVar23 + uVar27;
                bVar18 = (bool)((byte)(uVar29 >> 1) & 1);
                bVar4 = (bool)((byte)(uVar29 >> 2) & 1);
                bVar5 = (bool)((byte)(uVar29 >> 3) & 1);
                bVar6 = (bool)((byte)(uVar29 >> 4) & 1);
                bVar7 = (bool)((byte)(uVar29 >> 5) & 1);
                bVar8 = (bool)((byte)(uVar29 >> 6) & 1);
                bVar9 = (bool)((byte)(uVar29 >> 7) & 1);
                bVar10 = (bool)(bVar20 >> 1 & 1);
                bVar11 = (bool)(bVar20 >> 2 & 1);
                bVar12 = (bool)(bVar20 >> 3 & 1);
                bVar13 = (bool)(bVar20 >> 4 & 1);
                bVar14 = (bool)(bVar20 >> 5 & 1);
                bVar15 = (bool)(bVar20 >> 6 & 1);
                *pfVar1 = (float)((uint)(bVar19 & 1) * auVar34._0_4_ |
                                 (uint)!(bool)(bVar19 & 1) * (int)*pfVar1);
                pfVar1[1] = (float)((uint)bVar18 * auVar34._4_4_ | (uint)!bVar18 * (int)pfVar1[1]);
                pfVar1[2] = (float)((uint)bVar4 * auVar34._8_4_ | (uint)!bVar4 * (int)pfVar1[2]);
                pfVar1[3] = (float)((uint)bVar5 * auVar34._12_4_ | (uint)!bVar5 * (int)pfVar1[3]);
                pfVar1[4] = (float)((uint)bVar6 * auVar34._16_4_ | (uint)!bVar6 * (int)pfVar1[4]);
                pfVar1[5] = (float)((uint)bVar7 * auVar34._20_4_ | (uint)!bVar7 * (int)pfVar1[5]);
                pfVar1[6] = (float)((uint)bVar8 * auVar34._24_4_ | (uint)!bVar8 * (int)pfVar1[6]);
                pfVar1[7] = (float)((uint)bVar9 * auVar34._28_4_ | (uint)!bVar9 * (int)pfVar1[7]);
                pfVar1[8] = (float)((uint)(bVar20 & 1) * auVar34._32_4_ |
                                   (uint)!(bool)(bVar20 & 1) * (int)pfVar1[8]);
                pfVar1[9] = (float)((uint)bVar10 * auVar34._36_4_ | (uint)!bVar10 * (int)pfVar1[9]);
                pfVar1[10] = (float)((uint)bVar11 * auVar34._40_4_ | (uint)!bVar11 * (int)pfVar1[10]
                                    );
                pfVar1[0xb] = (float)((uint)bVar12 * auVar34._44_4_ |
                                     (uint)!bVar12 * (int)pfVar1[0xb]);
                pfVar1[0xc] = (float)((uint)bVar13 * auVar34._48_4_ |
                                     (uint)!bVar13 * (int)pfVar1[0xc]);
                pfVar1[0xd] = (float)((uint)bVar14 * auVar34._52_4_ |
                                     (uint)!bVar14 * (int)pfVar1[0xd]);
                pfVar1[0xe] = (float)((uint)bVar15 * auVar34._56_4_ |
                                     (uint)!bVar15 * (int)pfVar1[0xe]);
                pfVar1[0xf] = (float)((uint)(bVar20 >> 7) * auVar34._60_4_ |
                                     (uint)!(bool)(bVar20 >> 7) * (int)pfVar1[0xf]);
                uVar27 = uVar27 + 0x10;
              } while ((iVar22 + 0xfU & 0xfffffff0) != uVar27);
            }
            iVar25 = iVar25 + 1;
            iVar23 = iVar23 + iVar3 * iVar24;
          } while (iVar25 != iVar2);
        }
      }
      if ((this->kFlags & 0x400) == 0) {
        scaleFactors[lVar28] = fVar30;
        if (cumulativeScaleFactors != (float *)0x0) {
          dVar36 = log((double)fVar30);
          fVar30 = (float)(dVar36 + (double)cumulativeScaleFactors[lVar28]);
LAB_0013d798:
          cumulativeScaleFactors[lVar28] = fVar30;
        }
      }
      else {
        dVar36 = log((double)fVar30);
        scaleFactors[lVar28] = (float)dVar36;
        if (cumulativeScaleFactors != (float *)0x0) {
          fVar30 = (float)dVar36 + cumulativeScaleFactors[lVar28];
          goto LAB_0013d798;
        }
      }
      auVar31 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      lVar28 = lVar28 + 1;
    } while (lVar28 < this->kPatternCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::rescalePartials(REALTYPE* destP,
        REALTYPE* scaleFactors,
        REALTYPE* cumulativeScaleFactors,
        const int  fillWithOnes) {
    if (DEBUGGING_OUTPUT) {
        std::cerr << "destP (before rescale): \n";// << destP << "\n";
        for(int i=0; i<kPartialsSize; i++)
            fprintf(stderr,"destP[%d] = %.5f\n",i,destP[i]);
    }

    // TODO None of the code below has been optimized.
    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE max = 0;
        const int patternOffset = k * kPartialsPaddedStateCount;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
        }

        if (max == 0)
            max = 1.0;

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++)
                destP[offset++] *= oneOverMax;
        }

        if (kFlags & BEAGLE_FLAG_SCALERS_LOG) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
    if (DEBUGGING_OUTPUT) {
        for(int i=0; i<kPatternCount; i++)
            fprintf(stderr,"new scaleFactor[%d] = %.5f\n",i,scaleFactors[i]);
    }
}